

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * __thiscall
el::base::TypedConfigurations::resolveFilename
          (string *__return_storage_ptr__,TypedConfigurations *this,string *filename)

{
  undefined *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  DateTime *this_00;
  SubsecondPrecision *in_RCX;
  bool bVar6;
  undefined1 local_290 [8];
  string now;
  SubsecondPrecision ssPrec;
  string local_240 [32];
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [380];
  int local_94;
  string local_90 [4];
  int count;
  string fmt;
  char *ptr;
  allocator local_51;
  undefined1 local_50 [8];
  string dateTimeFormatSpecifierStr;
  size_t dateIndex;
  string *filename_local;
  TypedConfigurations *this_local;
  string *resultingFilename;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  puVar1 = consts::kDateTimeFormatSpecifierForFilename;
  dateTimeFormatSpecifierStr.field_2._8_8_ = 0xffffffffffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,puVar1,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  uVar3 = std::__cxx11::string::c_str();
  dateTimeFormatSpecifierStr.field_2._8_8_ =
       std::__cxx11::string::find((char *)__return_storage_ptr__,uVar3);
  if (dateTimeFormatSpecifierStr.field_2._8_8_ != -1) {
    while( true ) {
      bVar6 = false;
      if (dateTimeFormatSpecifierStr.field_2._8_8_ != 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        bVar6 = *pcVar4 == '%';
      }
      if (!bVar6) break;
      uVar3 = std::__cxx11::string::c_str();
      dateTimeFormatSpecifierStr.field_2._8_8_ =
           std::__cxx11::string::find((char *)__return_storage_ptr__,uVar3);
    }
    if (dateTimeFormatSpecifierStr.field_2._8_8_ != -1) {
      lVar5 = std::__cxx11::string::c_str();
      fmt.field_2._8_8_ = lVar5 + dateTimeFormatSpecifierStr.field_2._8_8_;
      lVar5 = std::__cxx11::string::size();
      fmt.field_2._8_8_ = lVar5 + fmt.field_2._8_8_;
      std::__cxx11::string::string(local_90);
      uVar3 = std::__cxx11::string::size();
      puVar1 = consts::kDefaultDateTimeFormatInFilename;
      if (((ulong)dateTimeFormatSpecifierStr.field_2._8_8_ < uVar3) &&
         (*(char *)fmt.field_2._8_8_ == '{')) {
        fmt.field_2._8_8_ = fmt.field_2._8_8_ + 1;
        local_94 = 1;
        std::__cxx11::stringstream::stringstream(local_220);
        for (; uVar2 = dateTimeFormatSpecifierStr.field_2._8_8_, *(char *)fmt.field_2._8_8_ != '\0';
            fmt.field_2._8_8_ = fmt.field_2._8_8_ + 1) {
          if (*(char *)fmt.field_2._8_8_ == '}') {
            local_94 = local_94 + 1;
            break;
          }
          std::operator<<(local_210,*(char *)fmt.field_2._8_8_);
          local_94 = local_94 + 1;
        }
        lVar5 = std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2 + lVar5);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=(local_90,local_240);
        std::__cxx11::string::~string(local_240);
        std::__cxx11::stringstream::~stringstream(local_220);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&ssPrec.m_offset,puVar1,(allocator *)((long)&ssPrec.m_width + 3));
        std::__cxx11::string::operator=(local_90,(string *)&ssPrec.m_offset);
        std::__cxx11::string::~string((string *)&ssPrec.m_offset);
        std::allocator<char>::~allocator((allocator<char> *)((long)&ssPrec.m_width + 3));
      }
      SubsecondPrecision::SubsecondPrecision((SubsecondPrecision *)((long)&now.field_2 + 0xc),3);
      this_00 = (DateTime *)std::__cxx11::string::c_str();
      utils::DateTime::getDateTime_abi_cxx11_
                ((string *)local_290,this_00,now.field_2._M_local_buf + 0xc,in_RCX);
      utils::Str::replaceAll((string *)local_290,'/','-');
      utils::Str::replaceAll(__return_storage_ptr__,(string *)local_50,(string *)local_290);
      std::__cxx11::string::~string((string *)local_290);
      std::__cxx11::string::~string(local_90);
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string TypedConfigurations::resolveFilename(const std::string& filename) {
  std::string resultingFilename = filename;
  std::size_t dateIndex = std::string::npos;
  std::string dateTimeFormatSpecifierStr = std::string(base::consts::kDateTimeFormatSpecifierForFilename);
  if ((dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str())) != std::string::npos) {
    while (dateIndex > 0 && resultingFilename[dateIndex - 1] == base::consts::kFormatSpecifierChar) {
      dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str(), dateIndex + 1);
    }
    if (dateIndex != std::string::npos) {
      const char* ptr = resultingFilename.c_str() + dateIndex;
      // Goto end of specifier
      ptr += dateTimeFormatSpecifierStr.size();
      std::string fmt;
      if ((resultingFilename.size() > dateIndex) && (ptr[0] == '{')) {
        // User has provided format for date/time
        ++ptr;
        int count = 1;  // Start by 1 in order to remove starting brace
        std::stringstream ss;
        for (; *ptr; ++ptr, ++count) {
          if (*ptr == '}') {
            ++count;  // In order to remove ending brace
            break;
          }
          ss << *ptr;
        }
        resultingFilename.erase(dateIndex + dateTimeFormatSpecifierStr.size(), count);
        fmt = ss.str();
      } else {
        fmt = std::string(base::consts::kDefaultDateTimeFormatInFilename);
      }
      base::SubsecondPrecision ssPrec(3);
      std::string now = base::utils::DateTime::getDateTime(fmt.c_str(), &ssPrec);
      base::utils::Str::replaceAll(now, '/', '-'); // Replace path element since we are dealing with filename
      base::utils::Str::replaceAll(resultingFilename, dateTimeFormatSpecifierStr, now);
    }
  }
  return resultingFilename;
}